

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O1

void __thiscall
crnlib::Resampler::Resampler
          (Resampler *this,int src_x,int src_y,int dst_x,int dst_y,Boundary_Op boundary_op,
          Resample_Real sample_low,Resample_Real sample_high,char *Pfilter_name,
          Contrib_List *Pclist_x,Contrib_List *Pclist_y,Resample_Real filter_x_scale,
          Resample_Real filter_y_scale,Resample_Real src_x_ofs,Resample_Real src_y_ofs)

{
  Resample_Real filter_support;
  int iVar1;
  int iVar2;
  _func_Resample_Real_Resample_Real *Pfilter;
  Contrib *pCVar3;
  bool bVar4;
  int iVar5;
  Sample *pSVar6;
  Contrib_List *pCVar7;
  int *piVar8;
  uchar *puVar9;
  Scan_Buf *pSVar10;
  Status SVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  char *__s1;
  char *__s2;
  
  this->m_lo = sample_low;
  this->m_hi = sample_high;
  this->m_intermediate_x = 0;
  this->m_status = STATUS_OKAY;
  this->m_Pdst_buf = (Sample *)0x0;
  this->m_Ptmp_buf = (Sample *)0x0;
  this->m_Pclist_x = (Contrib_List *)0x0;
  this->m_Pclist_y = (Contrib_List *)0x0;
  *(undefined4 *)((long)&this->m_Pclist_y + 7) = 0;
  this->m_Psrc_y_count = (int *)0x0;
  this->m_Psrc_y_flag = (uchar *)0x0;
  this->m_Pscan_buf = (Scan_Buf *)0x0;
  this->m_resample_src_x = src_x;
  this->m_resample_src_y = src_y;
  this->m_resample_dst_x = dst_x;
  this->m_resample_dst_y = dst_y;
  this->m_boundary_op = boundary_op;
  pSVar6 = (Sample *)crnlib_malloc((long)dst_x << 2);
  this->m_Pdst_buf = pSVar6;
  if (pSVar6 != (Sample *)0x0) {
    __s1 = "lanczos4";
    if (Pfilter_name != (char *)0x0) {
      __s1 = Pfilter_name;
    }
    __s2 = "box";
    uVar17 = 0;
    do {
      iVar5 = strcmp(__s1,__s2);
      if (iVar5 == 0) goto LAB_001456df;
      uVar17 = uVar17 + 1;
      __s2 = __s2 + 0x30;
    } while (uVar17 != 0x10);
    uVar17 = 0x10;
LAB_001456df:
    SVar11 = STATUS_BAD_FILTER_NAME;
    if ((int)uVar17 == 0x10) goto LAB_00145958;
    lVar12 = (uVar17 & 0xffffffff) * 0x30;
    Pfilter = *(_func_Resample_Real_Resample_Real **)(&DAT_001ceac0 + lVar12);
    filter_support = *(Resample_Real *)(&DAT_001ceac8 + lVar12);
    if (Pclist_x == (Contrib_List *)0x0) {
      pCVar7 = make_clist(this->m_resample_src_x,this->m_resample_dst_x,this->m_boundary_op,Pfilter,
                          filter_support,filter_x_scale,src_x_ofs);
      this->m_Pclist_x = pCVar7;
      if (pCVar7 == (Contrib_List *)0x0) goto LAB_00145953;
    }
    else {
      this->m_Pclist_x = Pclist_x;
      this->m_clist_x_forced = true;
    }
    if (Pclist_y == (Contrib_List *)0x0) {
      pCVar7 = make_clist(this->m_resample_src_y,this->m_resample_dst_y,this->m_boundary_op,Pfilter,
                          filter_support,filter_y_scale,src_y_ofs);
      this->m_Pclist_y = pCVar7;
      if (pCVar7 == (Contrib_List *)0x0) goto LAB_00145953;
    }
    else {
      this->m_Pclist_y = Pclist_y;
      this->m_clist_y_forced = true;
    }
    piVar8 = (int *)crnlib_calloc((long)this->m_resample_src_y,4,(size_t *)0x0);
    this->m_Psrc_y_count = piVar8;
    if (piVar8 != (int *)0x0) {
      puVar9 = (uchar *)crnlib_calloc((long)this->m_resample_src_y,1,(size_t *)0x0);
      this->m_Psrc_y_flag = puVar9;
      if (puVar9 != (uchar *)0x0) {
        if (0 < this->m_resample_dst_y) {
          pCVar7 = this->m_Pclist_y;
          piVar8 = this->m_Psrc_y_count;
          lVar12 = 0;
          do {
            uVar17 = (ulong)pCVar7[lVar12].n;
            if (uVar17 != 0) {
              pCVar3 = pCVar7[lVar12].p;
              uVar15 = 0;
              do {
                piVar8[pCVar3[uVar15].pixel] = piVar8[pCVar3[uVar15].pixel] + 1;
                uVar15 = uVar15 + 1;
              } while (uVar17 != uVar15);
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < this->m_resample_dst_y);
        }
        pSVar10 = (Scan_Buf *)crnlib_malloc(0x30000);
        this->m_Pscan_buf = pSVar10;
        if (pSVar10 != (Scan_Buf *)0x0) {
          lVar12 = -0x10000;
          do {
            pSVar10 = this->m_Pscan_buf;
            *(undefined4 *)((long)pSVar10->scan_buf_l + lVar12) = 0xffffffff;
            *(undefined8 *)((long)pSVar10[1].scan_buf_y + lVar12 * 2) = 0;
            lVar12 = lVar12 + 4;
          } while (lVar12 != 0);
          this->m_cur_src_y = 0;
          this->m_cur_dst_y = 0;
          iVar5 = this->m_resample_dst_x;
          iVar14 = 0;
          iVar13 = 0;
          if (0 < (long)iVar5) {
            lVar12 = 0;
            iVar13 = 0;
            do {
              iVar13 = iVar13 + (uint)*(ushort *)((long)&this->m_Pclist_x->n + lVar12);
              lVar12 = lVar12 + 0x10;
            } while ((long)iVar5 << 4 != lVar12);
          }
          iVar1 = this->m_resample_dst_y;
          if (0 < (long)iVar1) {
            lVar12 = 0;
            iVar14 = 0;
            do {
              iVar14 = iVar14 + (uint)*(ushort *)((long)&this->m_Pclist_y->n + lVar12);
              lVar12 = lVar12 + 0x10;
            } while ((long)iVar1 << 4 != lVar12);
            iVar14 = iVar14 * 4;
          }
          iVar16 = (iVar5 * iVar14) / 3 + this->m_resample_src_y * iVar13;
          iVar2 = this->m_resample_src_x;
          iVar13 = iVar1 * iVar13 + (iVar14 * iVar2) / 3;
          bVar4 = true;
          piVar8 = &this->m_resample_src_x;
          if ((iVar16 <= iVar13) &&
             (bVar4 = iVar2 < iVar5 && iVar16 == iVar13, iVar2 >= iVar5 || iVar16 != iVar13)) {
            piVar8 = &this->m_resample_dst_x;
          }
          this->m_delay_x_resample = bVar4;
          iVar5 = *piVar8;
          this->m_intermediate_x = iVar5;
          if (bVar4 == false) {
            return;
          }
          pSVar6 = (Sample *)crnlib_malloc((long)iVar5 << 2);
          this->m_Ptmp_buf = pSVar6;
          SVar11 = STATUS_OUT_OF_MEMORY;
          if (pSVar6 != (Sample *)0x0) {
            return;
          }
          goto LAB_00145958;
        }
      }
    }
  }
LAB_00145953:
  SVar11 = STATUS_OUT_OF_MEMORY;
LAB_00145958:
  this->m_status = SVar11;
  return;
}

Assistant:

Resampler::Resampler(int src_x, int src_y,
        int dst_x, int dst_y,
        Boundary_Op boundary_op,
        Resample_Real sample_low, Resample_Real sample_high,
        const char* Pfilter_name,
        Contrib_List* Pclist_x,
        Contrib_List* Pclist_y,
        Resample_Real filter_x_scale,
        Resample_Real filter_y_scale,
        Resample_Real src_x_ofs,
        Resample_Real src_y_ofs)
    {
        int i, j;
        Resample_Real support, (*func)(Resample_Real);

        resampler_assert(src_x > 0);
        resampler_assert(src_y > 0);
        resampler_assert(dst_x > 0);
        resampler_assert(dst_y > 0);

#if CRNLIB_RESAMPLER_DEBUG_OPS
        total_ops = 0;
#endif

        m_lo = sample_low;
        m_hi = sample_high;

        m_delay_x_resample = false;
        m_intermediate_x = 0;
        m_Pdst_buf = nullptr;
        m_Ptmp_buf = nullptr;
        m_clist_x_forced = false;
        m_Pclist_x = nullptr;
        m_clist_y_forced = false;
        m_Pclist_y = nullptr;
        m_Psrc_y_count = nullptr;
        m_Psrc_y_flag = nullptr;
        m_Pscan_buf = nullptr;
        m_status = STATUS_OKAY;

        m_resample_src_x = src_x;
        m_resample_src_y = src_y;
        m_resample_dst_x = dst_x;
        m_resample_dst_y = dst_y;

        m_boundary_op = boundary_op;

        if ((m_Pdst_buf = (Sample*)crnlib_malloc(m_resample_dst_x * sizeof(Sample))) == nullptr)
        {
            m_status = STATUS_OUT_OF_MEMORY;
            return;
        }

        // Find the specified filter.

        if (Pfilter_name == nullptr)
        {
            Pfilter_name = CRNLIB_RESAMPLER_DEFAULT_FILTER;
        }

        for (i = 0; i < g_num_resample_filters; i++)
        {
            if (strcmp(Pfilter_name, g_resample_filters[i].name) == 0)
            {
                break;
            }
        }

        if (i == g_num_resample_filters)
        {
            m_status = STATUS_BAD_FILTER_NAME;
            return;
        }

        func = g_resample_filters[i].func;
        support = g_resample_filters[i].support;

        /* Create contributor lists, unless the user supplied custom lists. */

        if (!Pclist_x)
        {
            m_Pclist_x = make_clist(m_resample_src_x, m_resample_dst_x, m_boundary_op, func, support, filter_x_scale, src_x_ofs);
            if (!m_Pclist_x)
            {
                m_status = STATUS_OUT_OF_MEMORY;
                return;
            }
        }
        else
        {
            m_Pclist_x = Pclist_x;
            m_clist_x_forced = true;
        }

        if (!Pclist_y)
        {
            m_Pclist_y = make_clist(m_resample_src_y, m_resample_dst_y, m_boundary_op, func, support, filter_y_scale, src_y_ofs);
            if (!m_Pclist_y)
            {
                m_status = STATUS_OUT_OF_MEMORY;
                return;
            }
        }
        else
        {
            m_Pclist_y = Pclist_y;
            m_clist_y_forced = true;
        }

        if ((m_Psrc_y_count = (int*)crnlib_calloc(m_resample_src_y, sizeof(int))) == nullptr)
        {
            m_status = STATUS_OUT_OF_MEMORY;
            return;
        }

        if ((m_Psrc_y_flag = (unsigned char*)crnlib_calloc(m_resample_src_y, sizeof(unsigned char))) == nullptr)
        {
            m_status = STATUS_OUT_OF_MEMORY;
            return;
        }

        /* Count how many times each source line
      * contributes to a destination line.
      */

        for (i = 0; i < m_resample_dst_y; i++)
        {
            for (j = 0; j < m_Pclist_y[i].n; j++)
            {
                m_Psrc_y_count[resampler_range_check(m_Pclist_y[i].p[j].pixel, m_resample_src_y)]++;
            }
        }

        if ((m_Pscan_buf = (Scan_Buf*)crnlib_malloc(sizeof(Scan_Buf))) == nullptr)
        {
            m_status = STATUS_OUT_OF_MEMORY;
            return;
        }

        for (i = 0; i < MAX_SCAN_BUF_SIZE; i++)
        {
            m_Pscan_buf->scan_buf_y[i] = -1;
            m_Pscan_buf->scan_buf_l[i] = nullptr;
        }

        m_cur_src_y = m_cur_dst_y = 0;
        {
            // Determine which axis to resample first by comparing the number of multiplies required
            // for each possibility.
            int x_ops = count_ops(m_Pclist_x, m_resample_dst_x);
            int y_ops = count_ops(m_Pclist_y, m_resample_dst_y);

            // Hack 10/2000: Weight Y axis ops a little more than X axis ops.
            // (Y axis ops use more cache resources.)
            int xy_ops = x_ops * m_resample_src_y +
                (4 * y_ops * m_resample_dst_x) / 3;

            int yx_ops = (4 * y_ops * m_resample_src_x) / 3 +
                x_ops * m_resample_dst_y;

#if CRNLIB_RESAMPLER_DEBUG_OPS
            printf("src: %i %i\n", m_resample_src_x, m_resample_src_y);
            printf("dst: %i %i\n", m_resample_dst_x, m_resample_dst_y);
            printf("x_ops: %i\n", x_ops);
            printf("y_ops: %i\n", y_ops);
            printf("xy_ops: %i\n", xy_ops);
            printf("yx_ops: %i\n", yx_ops);
#endif

            // Now check which resample order is better. In case of a tie, choose the order
            // which buffers the least amount of data.
            if ((xy_ops > yx_ops) ||
                ((xy_ops == yx_ops) && (m_resample_src_x < m_resample_dst_x)))
            {
                m_delay_x_resample = true;
                m_intermediate_x = m_resample_src_x;
            }
            else
            {
                m_delay_x_resample = false;
                m_intermediate_x = m_resample_dst_x;
            }
#if CRNLIB_RESAMPLER_DEBUG_OPS
            printf("delaying: %i\n", m_delay_x_resample);
#endif
        }

        if (m_delay_x_resample)
        {
            if ((m_Ptmp_buf = (Sample*)crnlib_malloc(m_intermediate_x * sizeof(Sample))) == nullptr)
            {
                m_status = STATUS_OUT_OF_MEMORY;
                return;
            }
        }
    }